

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::CreateOutputMaterials(SMDImporter *this)

{
  size_type sVar1;
  uint *puVar2;
  ulong uVar3;
  aiMaterial **ppaVar4;
  aiMaterial *paVar5;
  long lVar6;
  char *__src;
  undefined1 local_84c [8];
  aiString szName_1;
  aiColor3D clr;
  int iMode;
  aiMaterial *pcHelper;
  aiString szName;
  aiMaterial *pcMat;
  uint iMat;
  SMDImporter *this_local;
  
  _iMat = this;
  if (this->pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                  ,0x25a,"void Assimp::SMDImporter::CreateOutputMaterials()");
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->aszTextures);
  this->pScene->mNumMaterials = (uint)sVar1;
  pcMat._4_4_ = 1;
  puVar2 = std::max<unsigned_int>((uint *)((long)&pcMat + 4),&this->pScene->mNumMaterials);
  uVar3 = SUB168(ZEXT416(*puVar2) * ZEXT816(8),0);
  if (SUB168(ZEXT416(*puVar2) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar4 = (aiMaterial **)operator_new__(uVar3);
  this->pScene->mMaterials = ppaVar4;
  pcMat._0_4_ = 0;
  while( true ) {
    if (this->pScene->mNumMaterials <= (uint)pcMat) {
      if (this->pScene->mNumMaterials == 0) {
        this->pScene->mNumMaterials = 1;
        paVar5 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar5);
        *this->pScene->mMaterials = paVar5;
        clr.g = 2.8026e-45;
        unique0x1000049b = paVar5;
        aiMaterial::AddProperty<int>(paVar5,(int *)&clr.g,1,"$mat.shadingm",0,0);
        aiColor3D::aiColor3D((aiColor3D *)(szName_1.data + 0x3f8));
        builtin_strncpy(szName_1.data + 0x3f8,"333?333?",8);
        clr.r = 0.7;
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffbc8,(aiColor3D *)(szName_1.data + 0x3f8),1,"$clr.diffuse",0,0
                  );
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffbc8,(aiColor3D *)(szName_1.data + 0x3f8),1,"$clr.specular",0,
                   0);
        szName_1.data[0x3f8] = -0x33;
        szName_1.data[0x3f9] = -0x34;
        szName_1.data[0x3fa] = 'L';
        szName_1.data[0x3fb] = '=';
        szName_1.data[0x3fc] = -0x33;
        szName_1.data[0x3fd] = -0x34;
        szName_1.data[0x3fe] = 'L';
        szName_1.data[0x3ff] = '=';
        clr.r = 0.05;
        aiMaterial::AddProperty<aiColor3D>
                  (stack0xfffffffffffffbc8,(aiColor3D *)(szName_1.data + 0x3f8),1,"$clr.ambient",0,0
                  );
        aiString::aiString((aiString *)local_84c);
        aiString::Set((aiString *)local_84c,"DefaultMaterial");
        aiMaterial::AddProperty(stack0xfffffffffffffbc8,(aiString *)local_84c,"?mat.name",0,0);
      }
      return;
    }
    paVar5 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(paVar5);
    if (paVar5 == (aiMaterial *)0x0) break;
    this->pScene->mMaterials[(uint)pcMat] = paVar5;
    aiString::aiString((aiString *)&pcHelper);
    pcHelper._0_4_ = snprintf((char *)((long)&pcHelper + 4),0x400,"Texture_%u",(ulong)(uint)pcMat);
    aiMaterial::AddProperty(paVar5,(aiString *)&pcHelper,"?mat.name",0,0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->aszTextures,(ulong)(uint)pcMat);
    lVar6 = std::__cxx11::string::length();
    if (lVar6 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->aszTextures,(ulong)(uint)pcMat);
      __src = (char *)std::__cxx11::string::c_str();
      strncpy((char *)((long)&pcHelper + 4),__src,0x3ff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->aszTextures,(ulong)(uint)pcMat);
      pcHelper._0_4_ = std::__cxx11::string::length();
      aiMaterial::AddProperty(paVar5,(aiString *)&pcHelper,"$tex.file",1,0);
    }
    pcMat._0_4_ = (uint)pcMat + 1;
  }
  __assert_fail("nullptr != pcMat",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/SMD/SMDLoader.cpp"
                ,0x261,"void Assimp::SMDImporter::CreateOutputMaterials()");
}

Assistant:

void SMDImporter::CreateOutputMaterials() {
    ai_assert( nullptr != pScene );

    pScene->mNumMaterials = (unsigned int)aszTextures.size();
    pScene->mMaterials = new aiMaterial*[std::max(1u, pScene->mNumMaterials)];

    for (unsigned int iMat = 0; iMat < pScene->mNumMaterials; ++iMat) {
        aiMaterial* pcMat = new aiMaterial();
        ai_assert( nullptr != pcMat );
        pScene->mMaterials[iMat] = pcMat;

        aiString szName;
        szName.length = (size_t)ai_snprintf(szName.data,MAXLEN,"Texture_%u",iMat);
        pcMat->AddProperty(&szName,AI_MATKEY_NAME);

        if (aszTextures[iMat].length())
        {
            ::strncpy(szName.data, aszTextures[iMat].c_str(),MAXLEN-1);
            szName.length = aszTextures[iMat].length();
            pcMat->AddProperty(&szName,AI_MATKEY_TEXTURE_DIFFUSE(0));
        }
    }

    // create a default material if necessary
    if (0 == pScene->mNumMaterials) {
        pScene->mNumMaterials = 1;

        aiMaterial* pcHelper = new aiMaterial();
        pScene->mMaterials[0] = pcHelper;

        int iMode = static_cast<int>(aiShadingMode_Gouraud);
        pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

        aiColor3D clr;
        clr.b = clr.g = clr.r = 0.7f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

        clr.b = clr.g = clr.r = 0.05f;
        pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

        aiString szName;
        szName.Set(AI_DEFAULT_MATERIAL_NAME);
        pcHelper->AddProperty(&szName,AI_MATKEY_NAME);
    }
}